

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

char16 * __thiscall Js::ConcatStringMulti::GetSz(ConcatStringMulti *this)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  
  uVar2 = (ulong)this->slotCount;
  do {
    uVar4 = uVar2;
    if (uVar4 == 0) goto LAB_00b3d5f9;
    uVar2 = uVar4 - 1;
  } while ((&this->__alignmentPTR)[uVar4] != 0);
  if (uVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x21e,"(IsFilled())","IsFilled()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
LAB_00b3d5f9:
  pcVar6 = ConcatStringBase::GetSzImpl<Js::ConcatStringMulti>((ConcatStringBase *)this);
  memset(this + 1,0,(ulong)this->slotCount << 3);
  *(INT_PTR *)this = VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::Address;
  Memory::Recycler::WBSetBit((char *)&this->__alignment);
  *(undefined8 *)&this->__alignment = 0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->__alignment);
  return pcVar6;
}

Assistant:

const char16 *
    ConcatStringMulti::GetSz()
    {
        Assert(IsFilled());
        const char16 * sz = GetSzImpl<ConcatStringMulti>();

        // Allow slots to be garbage collected if no more refs.
        ClearArray(m_slots, slotCount);

        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return sz;
    }